

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

char * embree::parseSep(char **token)

{
  long lVar1;
  size_t sVar2;
  runtime_error *this;
  long *in_RDI;
  size_t sep;
  
  sVar2 = strspn((char *)*in_RDI," \t");
  if (sVar2 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"separator expected");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar1 = *in_RDI;
  *in_RDI = (long)(sVar2 + lVar1);
  return (char *)(sVar2 + lVar1);
}

Assistant:

static inline const char* parseSep(const char*& token) {
    size_t sep = strspn(token, " \t");
    if (!sep) THROW_RUNTIME_ERROR("separator expected");
    return token+=sep;
  }